

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void __thiscall AnonSimpleFile::AnonSimpleFile(AnonSimpleFile *this,string *FileName)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  char *__file;
  string *in_RSI;
  undefined8 *in_RDI;
  stat fileStat;
  string tmpname;
  stat local_d0;
  string local_40 [64];
  
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  in_RDI[2] = 0xffffffffffffffff;
  in_RDI[3] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 4),in_RSI);
  lf_random_string_abi_cxx11_();
  puVar2 = (undefined8 *)std::__cxx11::string::c_str();
  *in_RDI = *puVar2;
  piVar3 = __errno_location();
  *piVar3 = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0);
  *(int *)(in_RDI + 1) = iVar1;
  piVar3 = __errno_location();
  *(int *)((long)in_RDI + 0xc) = *piVar3;
  iVar1 = fstat(*(int *)(in_RDI + 1),&local_d0);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    *(int *)((long)in_RDI + 0xc) = *piVar3;
  }
  in_RDI[2] = local_d0.st_size;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

AnonSimpleFile(std::string FileName)
    {
        m_FileName = FileName;
        std::string tmpname = lf_random_string();
        struct stat fileStat;

        memcpy(&m_ID, tmpname.c_str(), sizeof(m_ID));
        errno = 0;
        m_FileDescriptor = open(FileName.c_str(), O_RDONLY);
        m_Errno = errno;
        if (fstat(m_FileDescriptor, &fileStat) == -1)
        {
            m_Errno = errno;
        }
        m_Size = static_cast<size_t>(fileStat.st_size);
    }